

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CRTC6845.hpp
# Opt level: O3

void __thiscall
Motorola::CRTC::
CRTC6845<PCCompatible::CGA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
::set_register(CRTC6845<PCCompatible::CGA::CRTCOutputter,_(Motorola::CRTC::Personality)0,_(Motorola::CRTC::CursorType)1>
               *this,uint8_t value)

{
  int iVar1;
  byte bVar2;
  anon_class_1_1_a8c68091 load_low;
  InterlaceMode IVar3;
  
  iVar1 = this->selected_register_;
  switch(iVar1) {
  case 0:
    (this->layout_).horizontal.total = value;
    break;
  case 1:
    (this->layout_).horizontal.displayed = value;
    break;
  case 2:
    (this->layout_).horizontal.start_sync = value;
    break;
  case 3:
    (this->layout_).horizontal.sync_width = value & 0xf;
    (this->layout_).vertical.sync_lines = value >> 4;
    break;
  case 4:
    (this->layout_).vertical.total = value & 0x7f;
    break;
  case 5:
    (this->layout_).vertical.adjust = value & 0x1f;
    break;
  case 6:
    (this->layout_).vertical.displayed = value & 0x7f;
    break;
  case 7:
    (this->layout_).vertical.start_sync = value & 0x7f;
    break;
  case 8:
    IVar3 = (uint)((value & 3) == 3) * 2;
    if ((value & 3) == 1) {
      IVar3 = InterlaceSync;
    }
    (this->layout_).interlace_mode_ = IVar3;
    bVar2 = value >> 4 & 3;
    if (bVar2 == 1) {
      this->display_skew_mask_ = 2;
    }
    else if (bVar2 == 2) {
      this->display_skew_mask_ = 4;
    }
    else {
      this->display_skew_mask_ = 1;
    }
    break;
  case 9:
    (this->layout_).vertical.end_row = value & 0x1f;
    break;
  case 10:
    (this->layout_).vertical.start_cursor = value & 0x1f;
    (this->layout_).cursor_flags = value >> 5 & 3;
    break;
  case 0xb:
    (this->layout_).vertical.end_cursor = value & 0x1f;
    break;
  case 0xc:
    *(byte *)((long)&(this->layout_).start_address + 1) = value & 0x3f;
    break;
  case 0xd:
    *(uint8_t *)&(this->layout_).start_address = value;
    break;
  case 0xe:
    *(byte *)((long)&(this->layout_).cursor_address + 1) = value & 0x3f;
    break;
  case 0xf:
    *(uint8_t *)&(this->layout_).cursor_address = value;
    break;
  default:
    if (0xf < iVar1) {
      return;
    }
  }
  this->registers_[iVar1] = value & set_register::masks[iVar1];
  return;
}

Assistant:

void set_register(uint8_t value) {
			static constexpr bool is_ega = is_egavga(personality);

			auto load_low = [value](uint16_t &target) {
				target = (target & 0xff00) | value;
			};
			auto load_high = [value](uint16_t &target) {
				constexpr uint8_t mask = RefreshMask >> 8;
				target = uint16_t((target & 0x00ff) | ((value & mask) << 8));
			};

			switch(selected_register_) {
				case 0:	layout_.horizontal.total = value;		break;
				case 1: layout_.horizontal.displayed = value;	break;
				case 2:	layout_.horizontal.start_sync = value;	break;
				case 3:
					layout_.horizontal.sync_width = value & 0xf;
					layout_.vertical.sync_lines = value >> 4;
					// TODO: vertical sync lines:
					// "(0 means 16 on some CRTC. Not present on all CRTCs, fixed to 16 lines on these)"
				break;
				case 4:	layout_.vertical.total = value & 0x7f;		break;
				case 5:	layout_.vertical.adjust = value & 0x1f;		break;
				case 6:	layout_.vertical.displayed = value & 0x7f;	break;
				case 7:	layout_.vertical.start_sync = value & 0x7f;	break;
				case 8:
					switch(value & 3) {
						default:	layout_.interlace_mode_ = InterlaceMode::Off;					break;
						case 0b01:	layout_.interlace_mode_ = InterlaceMode::InterlaceSync;			break;
						case 0b11:	layout_.interlace_mode_ = InterlaceMode::InterlaceSyncAndVideo;	break;
					}

					// Per CPC documentation, skew doesn't work on a "type 1 or 2", i.e. an MC6845 or a UM6845R.
					if(personality != Personality::UM6845R && personality != Personality::MC6845) {
						switch((value >> 4)&3) {
							default:	display_skew_mask_ = 1;		break;
							case 1:		display_skew_mask_ = 2;		break;
							case 2:		display_skew_mask_ = 4;		break;
						}
					}
				break;
				case 9:	layout_.vertical.end_row = value & 0x1f;	break;
				case 10:
					layout_.vertical.start_cursor = value & 0x1f;
					layout_.cursor_flags = (value >> 5) & 3;
				break;
				case 11:
					layout_.vertical.end_cursor = value & 0x1f;
				break;
				case 12:	load_high(layout_.start_address);	break;
				case 13:	load_low(layout_.start_address);	break;
				case 14:	load_high(layout_.cursor_address);	break;
				case 15:	load_low(layout_.cursor_address);	break;
			}

			static constexpr uint8_t masks[] = {
				0xff,	// Horizontal total.
				0xff,	// Horizontal display end.
				0xff,	// Start horizontal blank.
				0xff,	//
						// EGA: b0–b4: end of horizontal blank;
						// b5–b6: "Number of character clocks to delay start of display after Horizontal Total has been reached."

				is_ega ? 0xff : 0x7f,	// Start horizontal retrace.
				0x1f, 0x7f, 0x7f,
				0xff, 0x1f, 0x7f, 0x1f,
				uint8_t(RefreshMask >> 8), uint8_t(RefreshMask),
				uint8_t(RefreshMask >> 8), uint8_t(RefreshMask),
			};

			if(selected_register_ < 16) {
				registers_[selected_register_] = value & masks[selected_register_];
			}
			if(selected_register_ == 31 && personality == Personality::UM6845R) {
				dummy_register_ = value;
			}
		}